

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int is_nifti_file(char *hname)

{
  int iVar1;
  char *fname;
  size_t sVar2;
  int iVar3;
  znzFile fp;
  nifti_1_header nhdr;
  znzFile local_180;
  int local_174 [86];
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  iVar1 = nifti_validfilename(hname);
  iVar3 = -1;
  if (iVar1 != 0) {
    fname = nifti_findhdrname(hname);
    if (fname == (char *)0x0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** no header file found for \'%s\'\n",hname);
      }
    }
    else {
      iVar1 = nifti_is_gzfile(fname);
      local_180 = znzopen(fname,"rb",iVar1);
      free(fname);
      if (local_180 != (znzFile)0x0) {
        sVar2 = znzread(local_174,1,0x15c,local_180);
        Xznzclose(&local_180);
        if (0x15b < (int)sVar2) {
          if ((((local_1c == 'n') && (local_19 == '\0')) && (local_1b == 'i' || local_1b == '+')) &&
             (0xf6 < (byte)(local_1a - 0x3aU))) {
            iVar3 = (local_1b != '+') + 1;
          }
          else {
            iVar3 = 0;
            if (local_174[0] != 0x15c) {
              iVar3 = -(uint)(local_174[0] != 0x5c010000);
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int is_nifti_file( const char *hname )
{
   struct nifti_1_header nhdr ;
   znzFile fp ;
   int ii ;
   char *tmpname;

   /* bad input name? */

   if( !nifti_validfilename(hname) ) return -1 ;

   /* open file */

   tmpname = nifti_findhdrname(hname);
   if( tmpname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no header file found for '%s'\n",hname);
      return -1;
   }
   fp = znzopen( tmpname , "rb" , nifti_is_gzfile(tmpname) ) ;
   free(tmpname);
   if (znz_isnull(fp))                      return -1 ;  /* bad open? */

   /* read header, close file */

   ii = (int)znzread( &nhdr , 1 , sizeof(nhdr) , fp ) ;
   znzclose( fp ) ;
   if( ii < (int) sizeof(nhdr) )               return -1 ;  /* bad read? */

   /* check for NIFTI-ness */

   if( NIFTI_VERSION(nhdr) != 0 ){
     return ( NIFTI_ONEFILE(nhdr) ) ? 1 : 2 ;
   }

   /* check for ANALYZE-ness (sizeof_hdr field == 348) */

   ii = nhdr.sizeof_hdr ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   /* try byte-swapping header */

   swap_4(ii) ;
   if( ii == (int)sizeof(nhdr) ) return 0 ;  /* matches */

   return -1 ;                          /* not good */
}